

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_tcbind_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  uint local_18;
  uint32_t newval;
  uint32_t mask;
  target_ulong_conflict arg1_local;
  CPUMIPSState *env_local;
  
  local_18 = 0x20000;
  if ((env->mvp->CP0_MVPControl & 2U) != 0) {
    local_18 = 0x20001;
  }
  (env->active_tc).CP0_TCBind =
       (env->active_tc).CP0_TCBind & (local_18 ^ 0xffffffff) | arg1 & local_18;
  return;
}

Assistant:

void helper_mtc0_tcbind(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = (1 << CP0TCBd_TBE);
    uint32_t newval;

    if (env->mvp->CP0_MVPControl & (1 << CP0MVPCo_VPC)) {
        mask |= (1 << CP0TCBd_CurVPE);
    }
    newval = (env->active_tc.CP0_TCBind & ~mask) | (arg1 & mask);
    env->active_tc.CP0_TCBind = newval;
}